

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_config.c
# Opt level: O3

int pt_filter_addr_check(pt_conf_addr_filter *filter,uint64_t addr)

{
  ulong uVar1;
  long lVar2;
  
  if (filter == (pt_conf_addr_filter *)0x0) {
    return -1;
  }
  uVar1 = (filter->config).addr_cfg;
  lVar2 = 0;
  while (((((uint)(uVar1 >> ((byte)lVar2 & 0x3f)) & 0xf) != 2 ||
          (addr < *(ulong *)((long)filter->reserved + lVar2 * 4 + -0x40))) ||
         (*(ulong *)((long)filter->reserved + lVar2 * 4 + -0x38) < addr))) {
    lVar2 = lVar2 + 4;
    if (lVar2 == 0x20) {
      lVar2 = 0;
      while (((((uint)(uVar1 >> ((byte)lVar2 & 0x3f)) & 0xf) != 1 ||
              (addr < *(ulong *)((long)filter->reserved + lVar2 * 4 + -0x40))) ||
             (*(ulong *)((long)filter->reserved + lVar2 * 4 + -0x38) < addr))) {
        lVar2 = lVar2 + 4;
        if (lVar2 == 0x20) {
          lVar2 = 0;
          do {
            if (((uint)(uVar1 >> ((byte)lVar2 & 0x3f)) & 0xf) == 1) {
              return 0;
            }
            lVar2 = lVar2 + 4;
          } while (lVar2 != 0x20);
          return 1;
        }
      }
      return 1;
    }
  }
  return 0;
}

Assistant:

static int pt_filter_check_cfg_stop(const struct pt_conf_addr_filter *filter,
				    uint64_t addr)
{
	uint8_t n;

	if (!filter)
		return -pte_internal;

	for (n = 0; n < pt_filter_addr_ncfg(); ++n) {
		uint64_t addr_a, addr_b;
		uint32_t addr_cfg;

		addr_cfg = pt_filter_addr_cfg(filter, n);
		if (addr_cfg != pt_addr_cfg_stop)
			continue;

		addr_a = pt_filter_addr_a(filter, n);
		addr_b = pt_filter_addr_b(filter, n);

		/* Note that both A and B are inclusive. */
		if ((addr_a <= addr) && (addr <= addr_b))
			return 0;
	}

	return 1;
}